

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexImageCubeAlignCase::createTexture(TexImageCubeAlignCase *this)

{
  deUint32 target;
  deUint32 internalFormat;
  deUint32 format;
  deUint32 type;
  float fVar1;
  float width;
  int iVar2;
  reference pvVar3;
  int local_fc;
  int face;
  int local_cc;
  int cellSize;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  undefined1 local_98 [8];
  Vec4 colorB;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  undefined1 local_58 [8];
  Vec4 colorA;
  int rowPitch;
  int levelSize;
  int ndx;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  TexImageCubeAlignCase *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x8513,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  for (rowPitch = 0; rowPitch < (this->super_TextureCubeSpecCase).m_numLevels;
      rowPitch = rowPitch + 1) {
    colorA.m_data[3] =
         (float)de::max<int>(1,(this->super_TextureCubeSpecCase).m_size >> ((byte)rowPitch & 0x1f));
    iVar2 = tcu::TextureFormat::getPixelSize(&(this->super_TextureCubeSpecCase).m_texFormat);
    colorA.m_data[2] = (float)deAlign32(iVar2 * (int)colorA.m_data[3],this->m_alignment);
    tcu::Vector<float,_4>::Vector(&local_78,1.0,0.0,0.0,1.0);
    tcu::operator-((tcu *)(colorB.m_data + 2),
                   &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax,
                   &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin);
    tcu::operator*((tcu *)&local_68,&local_78,(Vector<float,_4> *)(colorB.m_data + 2));
    tcu::operator+((tcu *)local_58,&local_68,
                   &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin);
    tcu::Vector<float,_4>::Vector(&local_b8,0.0,1.0,0.0,1.0);
    tcu::operator-((tcu *)&stack0xffffffffffffff38,
                   &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax,
                   &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin);
    tcu::operator*((tcu *)&local_a8,&local_b8,(Vector<float,_4> *)&stack0xffffffffffffff38);
    tcu::operator+((tcu *)local_98,&local_a8,
                   &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin);
    local_cc = de::max<int>(1,(int)colorA.m_data[3] >> 2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
               (long)((int)colorA.m_data[2] * (int)colorA.m_data[3]));
    width = colorA.m_data[3];
    fVar1 = colorA.m_data[2];
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&stack0xffffffffffffff08,
               &(this->super_TextureCubeSpecCase).m_texFormat,(int)width,(int)width,1,(int)fVar1,0,
               pvVar3);
    tcu::fillWithGrid((PixelBufferAccess *)&stack0xffffffffffffff08,local_cc,(Vec4 *)local_58,
                      (Vec4 *)local_98);
    for (local_fc = 0; fVar1 = colorA.m_data[3], local_fc < 6; local_fc = local_fc + 1) {
      target = *(deUint32 *)(s_cubeMapFaces + (long)local_fc * 4);
      internalFormat = this->m_internalFormat;
      format = this->m_format;
      type = this->m_dataType;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
      sglr::ContextWrapper::glTexImage2D
                (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,
                 target,rowPitch,internalFormat,(int)fVar1,(int)fVar1,0,format,type,pvVar3);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelSize	= de::max(1, m_size >> ndx);
			int		rowPitch	= deAlign32(m_texFormat.getPixelSize()*levelSize, m_alignment);
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			int		cellSize	= de::max(1, levelSize >> 2);

			data.resize(rowPitch*levelSize);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, levelSize, levelSize, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, &data[0]);
		}
	}